

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

void __thiscall
cmCustomCommandGenerator::AppendArguments(cmCustomCommandGenerator *this,uint c,string *cmd)

{
  char *pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  char *local_d0;
  string local_b0;
  string local_90;
  char *local_60;
  char *location;
  string arg;
  uint j;
  cmCustomCommandLine *commandLine;
  uint offset;
  string *cmd_local;
  uint c_local;
  cmCustomCommandGenerator *this_local;
  
  pcVar1 = GetCrossCompilingEmulator(this,c);
  commandLine._4_4_ = (uint)(pcVar1 == (char *)0x0);
  this_00 = &std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::operator[]
                       (&(this->CommandLines).
                         super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                        (ulong)c)->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  for (arg.field_2._12_4_ = commandLine._4_4_; uVar2 = (ulong)(uint)arg.field_2._12_4_,
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(this_00), uVar2 < sVar3; arg.field_2._12_4_ = arg.field_2._12_4_ + 1) {
    std::__cxx11::string::string((string *)&location);
    if (arg.field_2._12_4_ == 0) {
      local_d0 = GetArgv0Location(this,c);
    }
    else {
      local_d0 = (char *)0x0;
    }
    local_60 = local_d0;
    if (local_d0 == (char *)0x0) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](this_00,(ulong)(uint)arg.field_2._12_4_);
      std::__cxx11::string::operator=((string *)&location,(string *)pvVar4);
    }
    else {
      std::__cxx11::string::operator=((string *)&location,local_d0);
    }
    std::__cxx11::string::operator+=((string *)cmd," ");
    if ((this->OldStyle & 1U) == 0) {
      cmOutputConverter::EscapeForShell
                (&local_b0,&this->LG->super_cmOutputConverter,(string *)&location,
                 (bool)(this->MakeVars & 1),false,false);
      std::__cxx11::string::operator+=((string *)cmd,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    else {
      escapeForShellOldStyle(&local_90,(string *)&location);
      std::__cxx11::string::operator+=((string *)cmd,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    std::__cxx11::string::~string((string *)&location);
  }
  return;
}

Assistant:

void cmCustomCommandGenerator::AppendArguments(unsigned int c,
                                               std::string& cmd) const
{
  unsigned int offset = 1;
  if (this->GetCrossCompilingEmulator(c) != nullptr) {
    offset = 0;
  }
  cmCustomCommandLine const& commandLine = this->CommandLines[c];
  for (unsigned int j = offset; j < commandLine.size(); ++j) {
    std::string arg;
    if (const char* location = j == 0 ? this->GetArgv0Location(c) : nullptr) {
      // GetCommand returned the emulator instead of the argv0 location,
      // so transform the latter now.
      arg = location;
    } else {
      arg = commandLine[j];
    }
    cmd += " ";
    if (this->OldStyle) {
      cmd += escapeForShellOldStyle(arg);
    } else {
      cmd += this->LG->EscapeForShell(arg, this->MakeVars);
    }
  }
}